

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT-common.h
# Opt level: O0

void do_recursion(w128_t *r,w128_t *a,w128_t *b,w128_t *lung)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t L1;
  uint64_t L0;
  uint64_t t1;
  uint64_t t0;
  w128_t *lung_local;
  w128_t *b_local;
  w128_t *a_local;
  w128_t *r_local;
  
  uVar1 = a->u[0];
  uVar2 = a->u[1];
  uVar3 = lung->u[0];
  lung->u[0] = uVar1 << 0x13 ^ lung->u[1] >> 0x20 ^ lung->u[1] << 0x20 ^ b->u[0];
  lung->u[1] = uVar2 << 0x13 ^ uVar3 >> 0x20 ^ uVar3 << 0x20 ^ b->u[1];
  r->u[0] = lung->u[0] >> 0xc ^ lung->u[0] & 0xffafffffffb3f ^ uVar1;
  r->u[1] = lung->u[1] >> 0xc ^ lung->u[1] & 0xffdfffc90fffd ^ uVar2;
  return;
}

Assistant:

inline static void do_recursion(w128_t *r, w128_t *a, w128_t * b,
                                w128_t *lung) {
    uint64_t t0, t1, L0, L1;

    t0 = a->u[0];
    t1 = a->u[1];
    L0 = lung->u[0];
    L1 = lung->u[1];
    lung->u[0] = (t0 << DSFMT_SL1) ^ (L1 >> 32) ^ (L1 << 32) ^ b->u[0];
    lung->u[1] = (t1 << DSFMT_SL1) ^ (L0 >> 32) ^ (L0 << 32) ^ b->u[1];
    r->u[0] = (lung->u[0] >> DSFMT_SR) ^ (lung->u[0] & DSFMT_MSK1) ^ t0;
    r->u[1] = (lung->u[1] >> DSFMT_SR) ^ (lung->u[1] & DSFMT_MSK2) ^ t1;
}